

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O2

int contest(nn_quant *nnq,int al,int b,int g,int r)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  nq_pixel *paiVar4;
  double dVar5;
  double dVar6;
  uint uVar7;
  int iVar8;
  uint uVar10;
  double dVar9;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar15;
  double dVar14;
  uint uVar16;
  uint uVar17;
  
  paiVar4 = nnq->network;
  uVar3 = 0;
  uVar1 = 0;
  dVar5 = 2147483647.0;
  dVar6 = 2147483647.0;
  for (uVar2 = 0; (long)uVar2 < (long)nnq->netsize; uVar2 = uVar2 + 1) {
    uVar7 = (*paiVar4)[0] - al;
    uVar10 = (*paiVar4)[1] - b;
    uVar11 = (*paiVar4)[2] - g;
    uVar12 = (*paiVar4)[3] - r;
    uVar13 = (int)uVar7 >> 0x1f;
    uVar15 = (int)uVar10 >> 0x1f;
    uVar16 = (int)uVar11 >> 0x1f;
    uVar17 = (int)uVar12 >> 0x1f;
    iVar8 = ((uVar12 ^ uVar17) - uVar17) + ((uVar10 ^ uVar15) - uVar15) +
            ((uVar11 ^ uVar16) - uVar16) + ((uVar7 ^ uVar13) - uVar13);
    dVar9 = (double)iVar8;
    if (dVar9 < dVar5) {
      uVar3 = (uint)uVar2;
    }
    dVar14 = (double)(iVar8 - (nnq->bias[uVar2] >> 0xc));
    if (dVar14 < dVar6) {
      uVar1 = uVar2 & 0xffffffff;
    }
    if (dVar5 <= dVar9) {
      dVar9 = dVar5;
    }
    if (dVar6 <= dVar14) {
      dVar14 = dVar6;
    }
    uVar7 = nnq->freq[uVar2];
    nnq->freq[uVar2] = uVar7 - ((int)uVar7 >> 10);
    nnq->bias[uVar2] = (uVar7 & 0xfffffc00) + nnq->bias[uVar2];
    paiVar4 = paiVar4 + 1;
    dVar5 = dVar9;
    dVar6 = dVar14;
  }
  nnq->freq[uVar3] = nnq->freq[uVar3] + 0x40;
  nnq->bias[uVar3] = nnq->bias[uVar3] + -0x10000;
  return (int)uVar1;
}

Assistant:

int contest(nnq, al,b,g,r)
nn_quant *nnq;
register int al,b,g,r;
{
	/* finds closest neuron (min dist) and updates freq */
	/* finds best neuron (min dist-bias) and returns position */
	/* for frequently chosen neurons, freq[i] is high and bias[i] is negative */
	/* bias[i] = gamma*((1/netsize)-freq[i]) */

	register int i,dist,a,biasdist,betafreq;
	unsigned int bestpos,bestbiaspos;
	double bestd,bestbiasd;
	register int *p,*f, *n;

	bestd = ~(((int) 1)<<31);
	bestbiasd = bestd;
	bestpos = 0;
	bestbiaspos = bestpos;
	p = nnq->bias;
	f = nnq->freq;

	for (i=0; i< nnq->netsize; i++) {
		n = nnq->network[i];
		dist = n[0] - al;
		if (dist<0) dist = -dist;
		a = n[1] - b;
		if (a<0) a = -a;
		dist += a;
		a = n[2] - g;
		if (a<0) a = -a;
		dist += a;
		a = n[3] - r;
		if (a<0) a = -a;
		dist += a;
		if (dist<bestd) {
			bestd=dist;
			bestpos=i;
		}
		biasdist = dist - ((*p)>>(intbiasshift-netbiasshift));
		if (biasdist<bestbiasd) {
			bestbiasd=biasdist;
			bestbiaspos=i;
		}
		betafreq = (*f >> betashift);
		*f++ -= betafreq;
		*p++ += (betafreq<<gammashift);
	}
	nnq->freq[bestpos] += beta;
	nnq->bias[bestpos] -= betagamma;
	return(bestbiaspos);
}